

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_59::InMemoryFile::write(InMemoryFile *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  size_t sVar2;
  Impl *pIVar3;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long_&>_> WVar4;
  uchar *puVar5;
  uchar *__src;
  ssize_t extraout_RAX;
  ssize_t sVar6;
  undefined4 in_register_00000034;
  Fault local_90;
  Fault f;
  undefined1 local_80 [8];
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  uint64_t end;
  undefined1 local_38 [8];
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  uint64_t offset_local;
  InMemoryFile *this_local;
  ArrayPtr<const_unsigned_char> data_local;
  
  lock.ptr = (Impl *)CONCAT44(in_register_00000034,__fd);
  this_local = (InMemoryFile *)__buf;
  data_local.ptr = (uchar *)__n;
  sVar2 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
  if (sVar2 == 0) {
    sVar6 = 0;
  }
  else {
    MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockExclusive
              ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_38,&this->impl);
    pIVar3 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_38);
    Impl::modified(pIVar3);
    pIVar3 = lock.ptr;
    sVar2 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
    _kjCondition._32_8_ = (long)&pIVar3->clock + sVar2;
    f.exception = (Exception *)
                  kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                             (unsigned_long *)&_kjCondition.result);
    kj::_::DebugExpression<unsigned_long&>::operator>=
              ((DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_80,
               (DebugExpression<unsigned_long&> *)&f,(unsigned_long *)&lock.ptr);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_80);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[33]>
                (&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x34a,FAILED,"end >= offset","_kjCondition,\"write() request overflows uint64\"",
                 (DebugComparison<unsigned_long_&,_unsigned_long_&> *)local_80,
                 (char (*) [33])"write() request overflows uint64");
      kj::_::Debug::Fault::fatal(&local_90);
    }
    pIVar3 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_38);
    Impl::ensureCapacity(pIVar3,_kjCondition._32_8_);
    pIVar3 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_38);
    WVar4 = max<unsigned_long&,unsigned_long&>(&pIVar3->size,(unsigned_long *)&_kjCondition.result);
    pIVar3 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_38);
    pIVar3->size = WVar4;
    pIVar3 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_38);
    puVar5 = Array<unsigned_char>::begin(&pIVar3->bytes);
    puVar5 = puVar5 + (long)lock.ptr;
    __src = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&this_local);
    sVar2 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
    memcpy(puVar5,__src,sVar2);
    Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked
              ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_38);
    sVar6 = extraout_RAX;
  }
  return sVar6;
}

Assistant:

void write(uint64_t offset, ArrayPtr<const byte> data) const override {
    if (data.size() == 0) return;
    auto lock = impl.lockExclusive();
    lock->modified();
    uint64_t end = offset + data.size();
    KJ_REQUIRE(end >= offset, "write() request overflows uint64");
    lock->ensureCapacity(end);
    lock->size = kj::max(lock->size, end);
    memcpy(lock->bytes.begin() + offset, data.begin(), data.size());
  }